

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void wallet::wallet_tests::TestLoadWallet
               (string *name,DatabaseFormat format,
               function<void_(std::shared_ptr<wallet::CWallet>)> f)

{
  function<void_(std::shared_ptr<wallet::CWallet>)> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bilingual_str *error_string;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  shared_ptr<wallet::CWallet> __args;
  const_string msg;
  undefined4 local_264;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  shared_ptr<wallet::CWallet> wallet;
  long *local_220;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  mutex_type *local_1f0;
  NodeContext node;
  undefined1 local_f0 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  bilingual_str error;
  DatabaseOptions local_80;
  Chain *local_38;
  
  local_38 = *(Chain **)(in_FS_OFFSET + 0x28);
  ::node::NodeContext::NodeContext(&node);
  interfaces::MakeChain((interfaces *)&local_1f0,&node);
  local_80.require_existing = false;
  local_80.require_create = false;
  local_80.create_flags = 0;
  local_80.create_passphrase._M_dataplus._M_p = (pointer)&local_80.create_passphrase.field_2;
  local_80.create_passphrase._M_string_length = 0;
  local_80.create_passphrase.field_2._M_local_buf[0] = '\0';
  local_80.verify = true;
  local_80.use_unsafe_sync = false;
  local_80.use_shared_memory = false;
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  local_80.max_log_mb = 100;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  local_80.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat> =
       (_Optional_base<wallet::DatabaseFormat,_true,_true>)((ulong)format | 0x100000000);
  error.translated.field_2._M_local_buf[0] = '\0';
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  error_string = &error;
  MakeWalletDatabase((wallet *)&local_220,name,&local_80,&status,error_string);
  criticalblock43.super_unique_lock._M_device = local_1f0;
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)&wallet,(char (*) [1])&criticalblock43,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xc7f1cc);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1ca;
  file.m_begin = (iterator)&local_240;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)error_string;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_250,msg);
  criticalblock43.super_unique_lock._M_owns = false;
  criticalblock43.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_011480b0;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_258 = "";
  local_f0._0_4_ =
       CWallet::LoadWallet(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  local_264 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
            (&criticalblock43,&local_260,0x1ca,1,2,local_f0,"wallet->LoadWallet()",&local_264,
             "DBErrors::LOAD_OK");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock43,
             &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              cs_wallet,"wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x1cb,false);
  std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)local_f0,
             &wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>);
  __args.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  __args.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f0;
  std::function<void_(std::shared_ptr<wallet::CWallet>)>::operator()(in_RDX,__args);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_220 != (long *)0x0) {
    (**(code **)(*local_220 + 8))();
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
  bilingual_str::~bilingual_str(&error);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            (&local_80.create_passphrase);
  if (local_1f0 != (mutex_type *)0x0) {
    (**(code **)((local_1f0->super___recursive_mutex_base)._M_mutex.__align + 8))();
  }
  ::node::NodeContext::~NodeContext(&node);
  if (*(Chain **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestLoadWallet(const std::string& name, DatabaseFormat format, std::function<void(std::shared_ptr<CWallet>)> f)
{
    node::NodeContext node;
    auto chain{interfaces::MakeChain(node)};
    DatabaseOptions options;
    options.require_format = format;
    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto database{MakeWalletDatabase(name, options, status, error)};
    auto wallet{std::make_shared<CWallet>(chain.get(), "", std::move(database))};
    BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
    WITH_LOCK(wallet->cs_wallet, f(wallet));
}